

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen12::CheckFmtDisplayDecompressible
          (PlatformInfoGen12 *this,GMM_TEXTURE_INFO *Surf,bool IsSupportedRGB64_16_16_16_16,
          bool IsSupportedRGB32_8_8_8_8,bool IsSupportedRGB32_2_10_10_10,
          bool IsSupportedMediaFormats)

{
  bool IsSupportedMediaFormats_local;
  bool IsSupportedRGB32_2_10_10_10_local;
  bool IsSupportedRGB32_8_8_8_8_local;
  bool IsSupportedRGB64_16_16_16_16_local;
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen12 *this_local;
  
  if ((((((((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0) &&
         (((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0)) &&
        (((ulong)(Surf->Flags).Info >> 0x2d & 1) != 0)) ||
       (((!IsSupportedRGB64_16_16_16_16 && (!IsSupportedRGB32_8_8_8_8)) &&
        (!IsSupportedRGB32_2_10_10_10)))) &&
      ((((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0 || (!IsSupportedMediaFormats)))) ||
     (((((ulong)(Surf->Flags).Info >> 0x24 & 1) == 0 &&
       (((ulong)(Surf->Flags).Info >> 0x2b & 1) == 0)) ||
      (((((ulong)(Surf->Flags).Info >> 0x25 & 1) != 0 ||
        (((ulong)(Surf->Flags).Info >> 0x26 & 1) != 0)) ||
       (((ulong)(Surf->Flags).Info >> 0x2c & 1) != 0)))))) {
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::CheckFmtDisplayDecompressible(GMM_TEXTURE_INFO &Surf,
                                                                 bool              IsSupportedRGB64_16_16_16_16,
                                                                 bool              IsSupportedRGB32_8_8_8_8,
                                                                 bool              IsSupportedRGB32_2_10_10_10,
                                                                 bool              IsSupportedMediaFormats)
{

    //Check fmt is display decompressible
    if (((Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed || !Surf.Flags.Info.NotCompressed) &&
        (IsSupportedRGB64_16_16_16_16 ||                             //RGB64 16:16 : 16 : 16 FP16
         IsSupportedRGB32_8_8_8_8 ||                                 //RGB32 8 : 8 : 8 : 8
         IsSupportedRGB32_2_10_10_10)) ||                            //RGB32 2 : 10 : 10 : 10) ||
       (Surf.Flags.Info.MediaCompressed && IsSupportedMediaFormats)) //YUV444 - Y412, Y416
    {
        //Display supports compression on TileY, but not Yf/Ys (deprecated for display support)
        if(GMM_IS_4KB_TILE(Surf.Flags) &&
           !(Surf.Flags.Info.TiledYf || GMM_IS_64KB_TILE(Surf.Flags)))
        {
            return true;
        }
    }
    return false;
}